

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

double __thiscall
NEST::LArNEST::GetDensity
          (LArNEST *this,double Kelvin,double bara,bool *inGas,uint64_t evtNum,double molarMass)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double density;
  double p_Pa;
  double VaporP_bar;
  double molarMass_local;
  uint64_t evtNum_local;
  bool *inGas_local;
  double bara_local;
  double Kelvin_local;
  LArNEST *this_local;
  
  dVar1 = log(Kelvin);
  dVar1 = exp(dVar1 * -6.539938 + (45.97394 - 1464.718291 / Kelvin));
  if ((bara < dVar1) || ((*inGas & 1U) != 0)) {
    dVar2 = bara * 100000.0;
    dVar3 = pow(this->fRIdealGas * Kelvin,3.0);
    dVar4 = pow(this->fRIdealGas * Kelvin,2.0);
    this_local = (LArNEST *)
                 ((1.0 / (dVar3 / (dVar2 * dVar4 + this->fRealGasA * dVar2 * dVar2) +
                         this->fRealGasB)) * molarMass * 1e-06);
    if ((bara < dVar1) && (evtNum == 0)) {
      std::operator<<((ostream *)&std::cerr,"\nWARNING: ARGON GAS PHASE. IS THAT WHAT YOU WANTED?\n"
                     );
    }
    *inGas = true;
  }
  else {
    *inGas = false;
    this_local = (LArNEST *)0x3ff6666666666666;
  }
  return (double)this_local;
}

Assistant:

double LArNEST::GetDensity(double Kelvin, double bara, bool &inGas,
                           uint64_t evtNum, double molarMass) {
  // currently only for fixed pressure
  // (the saturated vapor pressure); will add
  // pressure dependence later
  double VaporP_bar =
      exp(45.973940 - (1464.718291 / Kelvin) - (6.539938 * log(Kelvin)));
  if (bara < VaporP_bar || inGas) {
    double p_Pa = bara * 1e5;
    double density =
        1. /
        (pow(fRIdealGas * Kelvin, 3.) /
             (p_Pa * pow(fRIdealGas * Kelvin, 2.) + fRealGasA * p_Pa * p_Pa) +
         fRealGasB) *
        molarMass * 1e-6;  // Van der Waals equation, mol/m^3
    if (bara < VaporP_bar && evtNum == 0)
      // TODO: get rid of these output statements
      std::cerr << "\nWARNING: ARGON GAS PHASE. IS THAT WHAT YOU WANTED?\n";
    inGas = true;
    return density;
  } else {
    inGas = false;
    return 1.4;
  }
}